

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_code.hpp
# Opt level: O3

bool __thiscall
boost::system::error_category::std_category::equivalent
          (std_category *this,int code,error_condition *condition)

{
  std_category *psVar1;
  int iVar2;
  std_category *psVar3;
  error_category *peVar4;
  long lVar5;
  error_category *extraout_RDX;
  error_condition bn;
  
  psVar1 = (std_category *)condition->_M_cat;
  if (psVar1 == this) {
    peVar4 = this->pc_;
  }
  else {
    psVar3 = (std_category *)std::_V2::generic_category();
    if ((psVar1 == psVar3) || (peVar4 = generic_category(), psVar1 == &peVar4->std_cat_)) {
      generic_category();
    }
    else {
      lVar5 = __dynamic_cast(condition->_M_cat,&std::_V2::error_category::typeinfo,&typeinfo,0);
      if (lVar5 == 0) {
        iVar2 = (**(code **)(*(long *)this + 0x28))(this,code);
        return iVar2 == condition->_M_value && extraout_RDX == condition->_M_cat;
      }
    }
    peVar4 = this->pc_;
  }
  iVar2 = (*peVar4->_vptr_error_category[5])(peVar4,code);
  return (bool)(char)iVar2;
}

Assistant:

inline bool error_category::std_category::equivalent( int code,
      const std::error_condition & condition ) const BOOST_NOEXCEPT
    {
      if( condition.category() == *this )
      {
        boost::system::error_condition bn( condition.value(), *pc_ );
        return pc_->equivalent( code, bn );
      }
      else if( condition.category() == std::generic_category()
        || condition.category() == boost::system::generic_category() )
      {
        boost::system::error_condition bn( condition.value(),
          boost::system::generic_category() );

        return pc_->equivalent( code, bn );
      }
#ifndef BOOST_NO_RTTI
      else if( std_category const* pc2 = dynamic_cast< std_category const* >(
        &condition.category() ) )
      {
        boost::system::error_condition bn( condition.value(), *pc2->pc_ );
        return pc_->equivalent( code, bn );
      }
#endif
      else
      {
        return default_error_condition( code ) == condition;
      }
    }